

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall CGameConsole::Toggle(CGameConsole *this,int Type)

{
  float fVar1;
  float fVar2;
  int iVar3;
  CInstance *pCVar4;
  CGameConsole *this_00;
  float fVar5;
  float fVar6;
  
  iVar3 = this->m_ConsoleType;
  this->m_ConsoleType = Type;
  if (this->m_ConsoleState - 1U < 2 && iVar3 != Type) {
    pCVar4 = &this->m_RemoteConsole;
    if (Type != 1) {
      pCVar4 = &this->m_LocalConsole;
    }
    CLineInput::Activate(&pCVar4->m_Input,CONSOLE);
    return;
  }
  if ((this->m_ConsoleState & 0xfffffffdU) == 0) {
    fVar5 = TimeNow(this);
    fVar5 = fVar5 + this->m_StateChangeDuration;
  }
  else {
    fVar1 = this->m_StateChangeEnd;
    this_00 = this;
    fVar6 = TimeNow(this);
    fVar2 = this->m_StateChangeDuration;
    fVar5 = TimeNow(this_00);
    fVar5 = fVar5 + (fVar2 - (fVar1 - fVar6));
  }
  this->m_StateChangeEnd = fVar5;
  if ((this->m_ConsoleState != 3) && (this->m_ConsoleState != 0)) {
    (*(((this->super_CComponent).m_pClient)->m_pInput->super_IInterface)._vptr_IInterface[9])();
    (((this->super_CComponent).m_pClient)->m_UI).m_Enabled = true;
    pCVar4 = &this->m_LocalConsole;
    if (this->m_ConsoleType == 1) {
      pCVar4 = &this->m_RemoteConsole;
    }
    CLineInput::Activate(&pCVar4->m_Input,CONSOLE);
    (*(((this->super_CComponent).m_pClient)->super_IGameClient).super_IInterface._vptr_IInterface
      [0x17])();
    this->m_ConsoleState = 3;
    return;
  }
  (*(((this->super_CComponent).m_pClient)->m_pInput->super_IInterface)._vptr_IInterface[10])();
  (((this->super_CComponent).m_pClient)->m_UI).m_Enabled = false;
  pCVar4 = &this->m_LocalConsole;
  if (this->m_ConsoleType == 1) {
    pCVar4 = &this->m_RemoteConsole;
  }
  CLineInput::Deactivate(&pCVar4->m_Input);
  this->m_ConsoleState = 1;
  (*(((this->super_CComponent).m_pClient)->m_pControls->super_CComponent)._vptr_CComponent[7])();
  return;
}

Assistant:

void CGameConsole::Toggle(int Type)
{
	if(m_ConsoleType != Type && (m_ConsoleState == CONSOLE_OPEN || m_ConsoleState == CONSOLE_OPENING))
	{
		// don't toggle console, just switch what console to use
		m_ConsoleType = Type;
		CurrentConsole()->m_Input.Activate(CONSOLE);
	}
	else
	{
		m_ConsoleType = Type;
		if(m_ConsoleState == CONSOLE_CLOSED || m_ConsoleState == CONSOLE_OPEN)
		{
			m_StateChangeEnd = TimeNow()+m_StateChangeDuration;
		}
		else
		{
			float Progress = m_StateChangeEnd-TimeNow();
			float ReversedProgress = m_StateChangeDuration-Progress;

			m_StateChangeEnd = TimeNow()+ReversedProgress;
		}

		if(m_ConsoleState == CONSOLE_CLOSED || m_ConsoleState == CONSOLE_CLOSING)
		{
			Input()->MouseModeAbsolute();
			UI()->SetEnabled(false);
			CurrentConsole()->m_Input.Deactivate();
			m_ConsoleState = CONSOLE_OPENING;
			// reset controls
			m_pClient->m_pControls->OnReset();
		}
		else
		{
			Input()->MouseModeRelative();
			UI()->SetEnabled(true);
			CurrentConsole()->m_Input.Activate(CONSOLE);
			m_pClient->OnRelease();
			m_ConsoleState = CONSOLE_CLOSING;
		}
	}
}